

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

LY_ERR ly_path_parse(ly_ctx *ctx,lysc_node *ctx_node,char *str_path,size_t path_len,ly_bool lref,
                    uint16_t begin,uint16_t prefix,uint16_t pred,lyxp_expr **expr)

{
  bool bVar1;
  char *pcVar2;
  uint16_t uVar3;
  LY_ERR LVar4;
  int iVar5;
  lyxp_expr_type **pplVar6;
  char *s;
  char *pcVar7;
  ly_bool is_abs;
  char *ptr;
  char *prev_prefix;
  char *cur_node;
  uint32_t cur_len;
  uint32_t tok_idx;
  lyxp_expr *exp;
  LY_ERR ret;
  uint16_t begin_local;
  ly_bool lref_local;
  size_t path_len_local;
  char *str_path_local;
  lysc_node *ctx_node_local;
  ly_ctx *ctx_local;
  
  exp._0_4_ = 0;
  _cur_len = (lyxp_expr *)0x0;
  ptr = (char *)0x0;
  exp._4_2_ = begin;
  exp._7_1_ = lref;
  _ret = path_len;
  path_len_local = (size_t)str_path;
  str_path_local = (char *)ctx_node;
  ctx_node_local = (lysc_node *)ctx;
  if ((begin != 1) && (begin != 2)) {
    __assert_fail("(begin == LY_PATH_BEGIN_ABSOLUTE) || (begin == LY_PATH_BEGIN_EITHER)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x14d,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  if ((((prefix != 0x10) && (prefix != 0x20)) && (prefix != 0x40)) && (prefix != 0x80)) {
    __assert_fail("(prefix == LY_PATH_PREFIX_OPTIONAL) || (prefix == LY_PATH_PREFIX_MANDATORY) || (prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x14f,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  if (((pred != 0x100) && (pred != 0x200)) && (pred != 0x400)) {
    __assert_fail("(pred == LY_PATH_PRED_KEYS) || (pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_LEAFREF)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x150,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  if (ctx_node != (lysc_node *)0x0) {
    ly_log_location(ctx_node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  exp._0_4_ = lyxp_expr_parse((ly_ctx *)ctx_node_local,(char *)path_len_local,_ret,'\0',
                              (lyxp_expr **)&cur_len);
  if ((LY_ERR)exp == LY_SUCCESS) {
    cur_node._4_4_ = 0;
    pplVar6 = (lyxp_expr_type **)calloc((ulong)_cur_len->size,8);
    _cur_len->repeat = pplVar6;
    if (_cur_len->repeat == (lyxp_expr_type **)0x0) {
      ly_log((ly_ctx *)ctx_node_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "ly_path_parse");
      exp._0_4_ = LY_EMEM;
    }
    else {
      if (exp._4_2_ == 2) {
        LVar4 = lyxp_next_token((ly_ctx *)0x0,_cur_len,(uint32_t *)((long)&cur_node + 4),
                                LYXP_TOKEN_OPER_PATH);
        if (LVar4 == LY_SUCCESS) {
          bVar1 = true;
        }
        else {
          if (exp._7_1_ != '\0') {
            uVar3 = ly_ctx_get_options((ly_ctx *)ctx_node_local);
            if (((uVar3 & 0x200) != 0) &&
               (LVar4 = lyxp_check_token((ly_ctx *)0x0,_cur_len,cur_node._4_4_,LYXP_TOKEN_FUNCNAME),
               LVar4 == LY_SUCCESS)) {
              LVar4 = ly_path_parse_deref((ly_ctx *)ctx_node_local,(lysc_node *)str_path_local,
                                          _cur_len,(uint32_t *)((long)&cur_node + 4));
              if (LVar4 != LY_SUCCESS) {
                exp._0_4_ = LY_EVALID;
                goto LAB_00116333;
              }
              LVar4 = lyxp_next_token((ly_ctx *)ctx_node_local,_cur_len,
                                      (uint32_t *)((long)&cur_node + 4),LYXP_TOKEN_OPER_PATH);
              if (LVar4 != LY_SUCCESS) {
                exp._0_4_ = LY_EVALID;
                goto LAB_00116333;
              }
            }
            LVar4 = lyxp_next_token((ly_ctx *)ctx_node_local,_cur_len,
                                    (uint32_t *)((long)&cur_node + 4),LYXP_TOKEN_DDOT);
            if (LVar4 != LY_SUCCESS) {
              exp._0_4_ = LY_EVALID;
              goto LAB_00116333;
            }
            do {
              LVar4 = lyxp_next_token((ly_ctx *)ctx_node_local,_cur_len,
                                      (uint32_t *)((long)&cur_node + 4),LYXP_TOKEN_OPER_PATH);
              if (LVar4 != LY_SUCCESS) {
                exp._0_4_ = LY_EVALID;
                goto LAB_00116333;
              }
              LVar4 = lyxp_next_token((ly_ctx *)0x0,_cur_len,(uint32_t *)((long)&cur_node + 4),
                                      LYXP_TOKEN_DDOT);
            } while (LVar4 == LY_SUCCESS);
          }
          bVar1 = false;
        }
      }
      else {
        LVar4 = lyxp_next_token((ly_ctx *)ctx_node_local,_cur_len,(uint32_t *)((long)&cur_node + 4),
                                LYXP_TOKEN_OPER_PATH);
        if (LVar4 != LY_SUCCESS) {
          exp._0_4_ = LY_EVALID;
          goto LAB_00116333;
        }
        bVar1 = true;
      }
      do {
        LVar4 = lyxp_check_token((ly_ctx *)ctx_node_local,_cur_len,cur_node._4_4_,
                                 LYXP_TOKEN_NAMETEST);
        if (LVar4 != LY_SUCCESS) {
          exp._0_4_ = LY_EVALID;
          goto LAB_00116333;
        }
        s = _cur_len->expr + _cur_len->tok_pos[cur_node._4_4_];
        cur_node._0_4_ = _cur_len->tok_len[cur_node._4_4_];
        pcVar2 = ptr;
        if (prefix == 0x20) {
          pcVar7 = strnstr(s,":",(ulong)(uint)cur_node);
          if (pcVar7 == (char *)0x0) {
            ly_vlog((ly_ctx *)ctx_node_local,(char *)0x0,LYVE_XPATH,
                    "Prefix missing for \"%.*s\" in path.",(ulong)(uint)cur_node,s);
            exp._0_4_ = LY_EVALID;
            goto LAB_00116333;
          }
        }
        else if ((prefix == 0x40) || (prefix == 0x80)) {
          if ((ptr == (char *)0x0) && (bVar1)) {
            pcVar7 = strnstr(s,":",(ulong)(uint)cur_node);
            pcVar2 = s;
            if (pcVar7 == (char *)0x0) {
              ly_vlog((ly_ctx *)ctx_node_local,(char *)0x0,LYVE_XPATH,
                      "Prefix missing for \"%.*s\" in path.",(ulong)(uint)cur_node,s);
              exp._0_4_ = LY_EVALID;
              goto LAB_00116333;
            }
          }
          else if ((((ptr != (char *)0x0) && (prefix == 0x80)) &&
                   (pcVar7 = strnstr(s,":",(ulong)(uint)cur_node), pcVar7 != (char *)0x0)) &&
                  ((iVar5 = strncmp(ptr,s,(long)pcVar7 - (long)s), pcVar2 = s, iVar5 == 0 &&
                   (ptr[(long)pcVar7 - (long)s] == ':')))) {
            ly_vlog((ly_ctx *)ctx_node_local,(char *)0x0,LYVE_XPATH,
                    "Duplicate prefix for \"%.*s\" in path.",(ulong)(uint)cur_node,s);
            exp._0_4_ = LY_EVALID;
            goto LAB_00116333;
          }
        }
        ptr = pcVar2;
        cur_node._4_4_ = cur_node._4_4_ + 1;
        exp._0_4_ = ly_path_check_predicate
                              ((ly_ctx *)ctx_node_local,(lysc_node *)str_path_local,_cur_len,
                               (uint32_t *)((long)&cur_node + 4),prefix,pred);
        if ((LY_ERR)exp != LY_SUCCESS) goto LAB_00116333;
        LVar4 = lyxp_next_token((ly_ctx *)0x0,_cur_len,(uint32_t *)((long)&cur_node + 4),
                                LYXP_TOKEN_OPER_PATH);
      } while (LVar4 == LY_SUCCESS);
      if (_cur_len->used <= cur_node._4_4_) {
        *expr = _cur_len;
        ly_log_location_revert((uint)(str_path_local != (char *)0x0),0,0,0);
        return LY_SUCCESS;
      }
      ly_vlog((ly_ctx *)ctx_node_local,(char *)0x0,LYVE_XPATH,
              "Unparsed characters \"%s\" left at the end of path.",
              _cur_len->expr + _cur_len->tok_pos[cur_node._4_4_]);
      exp._0_4_ = LY_EVALID;
    }
  }
LAB_00116333:
  lyxp_expr_free((ly_ctx *)ctx_node_local,_cur_len);
  ly_log_location_revert((uint)(str_path_local != (char *)0x0),0,0,0);
  return (LY_ERR)exp;
}

Assistant:

LY_ERR
ly_path_parse(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *str_path, size_t path_len,
        ly_bool lref, uint16_t begin, uint16_t prefix, uint16_t pred, struct lyxp_expr **expr)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *exp = NULL;
    uint32_t tok_idx, cur_len;
    const char *cur_node, *prev_prefix = NULL, *ptr;
    ly_bool is_abs;

    assert((begin == LY_PATH_BEGIN_ABSOLUTE) || (begin == LY_PATH_BEGIN_EITHER));
    assert((prefix == LY_PATH_PREFIX_OPTIONAL) || (prefix == LY_PATH_PREFIX_MANDATORY) ||
            (prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT));
    assert((pred == LY_PATH_PRED_KEYS) || (pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_LEAFREF));

    if (ctx_node) {
        LOG_LOCSET(ctx_node, NULL);
    }

    /* parse as a generic XPath expression, reparse is performed manually */
    LY_CHECK_GOTO(ret = lyxp_expr_parse(ctx, str_path, path_len, 0, &exp), error);
    tok_idx = 0;

    /* alloc empty repeat (only '=', filled manually) */
    exp->repeat = calloc(exp->size, sizeof *exp->repeat);
    LY_CHECK_ERR_GOTO(!exp->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

    if (begin == LY_PATH_BEGIN_EITHER) {
        /* is the path relative? */
        if (lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_OPER_PATH)) {
            /* relative path check specific to leafref */
            if (lref) {
                /* optional function 'deref..' */
                if ((ly_ctx_get_options(ctx) & LY_CTX_LEAFREF_EXTENDED) &&
                        !lyxp_check_token(NULL, exp, tok_idx, LYXP_TOKEN_FUNCNAME)) {
                    LY_CHECK_ERR_GOTO(ly_path_parse_deref(ctx, ctx_node, exp, &tok_idx), ret = LY_EVALID, error);

                    /* '/' */
                    LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID,
                            error);
                }

                /* mandatory '..' */
                LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_DDOT), ret = LY_EVALID, error);

                do {
                    /* '/' */
                    LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID,
                            error);

                    /* optional '..' */
                } while (!lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_DDOT));
            }

            is_abs = 0;
        } else {
            is_abs = 1;
        }
    } else {
        /* '/' */
        LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID, error);

        is_abs = 1;
    }

    do {
        /* NameTest */
        LY_CHECK_ERR_GOTO(lyxp_check_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), ret = LY_EVALID, error);

        /* check prefix based on the options */
        cur_node = exp->expr + exp->tok_pos[tok_idx];
        cur_len = exp->tok_len[tok_idx];
        if (prefix == LY_PATH_PREFIX_MANDATORY) {
            if (!strnstr(cur_node, ":", cur_len)) {
                LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)cur_len, cur_node);
                ret = LY_EVALID;
                goto error;
            }
        } else if ((prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT)) {
            if (!prev_prefix && is_abs) {
                /* the first node must have a prefix */
                if (!strnstr(cur_node, ":", cur_len)) {
                    LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)cur_len, cur_node);
                    ret = LY_EVALID;
                    goto error;
                }

                /* remember the first prefix */
                prev_prefix = cur_node;
            } else if (prev_prefix && (prefix == LY_PATH_PREFIX_STRICT_INHERIT)) {
                /* the prefix must be different, if any */
                ptr = strnstr(cur_node, ":", cur_len);
                if (ptr) {
                    if (!strncmp(prev_prefix, cur_node, ptr - cur_node) && (prev_prefix[ptr - cur_node] == ':')) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate prefix for \"%.*s\" in path.", (int)cur_len, cur_node);
                        ret = LY_EVALID;
                        goto error;
                    }

                    /* remember this next prefix */
                    prev_prefix = cur_node;
                }
            }
        }

        ++tok_idx;

        /* Predicate* */
        LY_CHECK_GOTO(ret = ly_path_check_predicate(ctx, ctx_node, exp, &tok_idx, prefix, pred), error);

        /* '/' */
    } while (!lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_OPER_PATH));

    /* trailing token check */
    if (exp->used > tok_idx) {
        LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of path.", exp->expr + exp->tok_pos[tok_idx]);
        ret = LY_EVALID;
        goto error;
    }

    *expr = exp;

    LOG_LOCBACK(ctx_node ? 1 : 0, 0);
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, exp);
    LOG_LOCBACK(ctx_node ? 1 : 0, 0);
    return ret;
}